

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_get_str_kv_size_test(btree_kv_ops *kv_ops)

{
  size_t sVar1;
  size_t sVar2;
  char *__format;
  int v;
  char str [11];
  timeval __test_begin;
  undefined4 local_7c;
  char local_78 [16];
  btree local_68;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  memleak_start();
  builtin_strncpy(local_78,"teststring",0xb);
  sVar1 = strlen(local_78);
  local_68.ksize = (uint8_t)sVar1;
  local_68.vsize = 4;
  local_7c = 1;
  sVar2 = (*kv_ops->get_kv_size)(&local_68,local_78,&local_7c);
  sVar1 = strlen(local_78);
  if (sVar2 != sVar1 + 4) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x220);
    kv_get_str_kv_size_test(btree_kv_ops*)::__test_pass = '\x01';
    sVar1 = strlen(local_78);
    if (sVar2 != sVar1 + 4) {
      __assert_fail("size == (strlen(str) + sizeof(v))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x220,"void kv_get_str_kv_size_test(btree_kv_ops *)");
    }
  }
  sVar2 = (*kv_ops->get_kv_size)(&local_68,(void *)0x0,&local_7c);
  if (sVar2 != local_68.vsize) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x224);
    kv_get_str_kv_size_test(btree_kv_ops*)::__test_pass = '\x01';
    if (sVar2 != local_68.vsize) {
      __assert_fail("size == (tree->vsize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x224,"void kv_get_str_kv_size_test(btree_kv_ops *)");
    }
  }
  sVar2 = (*kv_ops->get_kv_size)(&local_68,local_78,(void *)0x0);
  sVar1 = strlen(local_78);
  if (sVar2 != sVar1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x228);
    kv_get_str_kv_size_test(btree_kv_ops*)::__test_pass = '\x01';
    sVar1 = strlen(local_78);
    if (sVar2 != sVar1) {
      __assert_fail("size == (strlen(str))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x228,"void kv_get_str_kv_size_test(btree_kv_ops *)");
    }
  }
  sVar2 = (*kv_ops->get_kv_size)(&local_68,(void *)0x0,(void *)0x0);
  if (sVar2 == 0) {
    memleak_end();
    __format = "%s PASSED\n";
    if (kv_get_str_kv_size_test(btree_kv_ops*)::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"kv_get_str_kv_size_test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
          ,0x22c);
  kv_get_str_kv_size_test(btree_kv_ops*)::__test_pass = '\x01';
  __assert_fail("size == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                ,0x22c,"void kv_get_str_kv_size_test(btree_kv_ops *)");
}

Assistant:

void kv_get_str_kv_size_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    btree *tree;
    int v;
    size_t size;
    char str[] = "teststring";

    tree = alca(struct btree, 1);
    tree->ksize = strlen(str);
    tree->vsize = sizeof(v);
    v = 1;

    // get/verify size of kv string
    size = kv_ops->get_kv_size(tree, str, (void *)&v);
    TEST_CHK(size == (strlen(str) + sizeof(v)));

    // verify with NULL key
    size = kv_ops->get_kv_size(tree, NULL, (void *)&v);
    TEST_CHK(size == (tree->vsize));

    // verify with NULL value
    size = kv_ops->get_kv_size(tree,&str, NULL);
    TEST_CHK(size == (strlen(str)));

    // NULL key/value
    size = kv_ops->get_kv_size(tree, NULL, NULL);
    TEST_CHK(size == 0);

    memleak_end();
    TEST_RESULT("kv_get_str_kv_size_test");
}